

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.h
# Opt level: O1

void __thiscall
ScriptCompression::Unser<HashVerifier<AutoFile>>
          (ScriptCompression *this,HashVerifier<AutoFile> *s,CScript *script)

{
  uint uVar1;
  undefined8 data;
  uint uVar2;
  uint uVar3;
  size_t in_RCX;
  CScript *pCVar4;
  long in_FS_OFFSET;
  CompressedScript vch;
  uchar local_59;
  direct_or_indirect local_58;
  uint local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = ReadVarInt<HashVerifier<AutoFile>,(VarIntMode)0,unsigned_int>(s);
  if (uVar2 < 6) {
    uVar3 = GetSpecialScriptSize(uVar2);
    local_59 = '\0';
    prevector<33U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<33U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,uVar3
               ,&local_59);
    uVar3 = local_34 - 0x22;
    data = local_58.indirect_contents.indirect;
    if (local_34 < 0x22) {
      uVar3 = local_34;
      data = &local_58;
    }
    AutoFile::read(s->m_source,(int)data,(void *)(ulong)uVar3,in_RCX);
    CSHA256::Write((CSHA256 *)s,(uchar *)data,(size_t)(ulong)uVar3);
    DecompressScript(script,uVar2,(CompressedScript *)&local_58.indirect_contents);
    if (0x21 < local_34) {
      free(local_58.indirect_contents.indirect);
      local_58.indirect_contents.indirect = (char *)0x0;
    }
  }
  else {
    uVar2 = uVar2 - 6;
    if (uVar2 < 0x2711) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&script->super_CScriptBase,uVar2);
      uVar2 = (script->super_CScriptBase)._size;
      uVar3 = uVar2 - 0x1d;
      pCVar4 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      if (uVar2 < 0x1d) {
        uVar3 = uVar2;
        pCVar4 = script;
      }
      AutoFile::read(s->m_source,(int)pCVar4,(void *)(ulong)uVar3,in_RCX);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        CSHA256::Write((CSHA256 *)s,(uchar *)pCVar4,(size_t)(ulong)uVar3);
        return;
      }
      goto LAB_0021ea5a;
    }
    uVar3 = (script->super_CScriptBase)._size;
    uVar1 = uVar3 - 0x1d;
    if (uVar3 < 0x1d) {
      uVar1 = uVar3;
    }
    pCVar4 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar3 < 0x1d) {
      pCVar4 = script;
    }
    local_58.direct[0] = 0x6a;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (&script->super_CScriptBase,
               (uchar *)((long)&(pCVar4->super_CScriptBase)._union + (long)(int)uVar1),
               (uchar *)local_58.direct);
    HashVerifier<AutoFile>::ignore(s,(ulong)uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_0021ea5a:
  __stack_chk_fail();
}

Assistant:

void Unser(Stream &s, CScript& script) {
        unsigned int nSize = 0;
        s >> VARINT(nSize);
        if (nSize < nSpecialScripts) {
            CompressedScript vch(GetSpecialScriptSize(nSize), 0x00);
            s >> Span{vch};
            DecompressScript(script, nSize, vch);
            return;
        }
        nSize -= nSpecialScripts;
        if (nSize > MAX_SCRIPT_SIZE) {
            // Overly long script, replace with a short invalid one
            script << OP_RETURN;
            s.ignore(nSize);
        } else {
            script.resize(nSize);
            s >> Span{script};
        }
    }